

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall
UniformData::set(UniformData *this,UniformValue *_value,size_t _size,bool _int,bool _queue)

{
  bool _queue_local;
  bool _int_local;
  size_t _size_local;
  UniformValue *_value_local;
  UniformData *this_local;
  
  this->bInt = _int;
  this->size = _size;
  if ((_queue) && ((this->change & 1U) != 0)) {
    std::
    queue<std::array<float,_4UL>,_std::deque<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
    ::push(&this->queue,_value);
  }
  else {
    *(undefined8 *)(this->value)._M_elems = *(undefined8 *)_value->_M_elems;
    *(undefined8 *)((this->value)._M_elems + 2) = *(undefined8 *)(_value->_M_elems + 2);
  }
  this->change = true;
  return;
}

Assistant:

void UniformData::set(const UniformValue &_value, size_t _size, bool _int, bool _queue) {
    bInt = _int;
    size = _size;

    if (_queue && change)
        queue.push( _value );
    else
        value = _value;
    
    change = true;
}